

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::schedule_impl
          (task_impl_base<_1a67ba37_> *this,bool reset,executor *executor)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  runner<_9c922731_> *this_01;
  size_t node_id;
  element_type *peVar4;
  element_type *this_02;
  anon_class_16_1_6a50d06e local_e0;
  function<void_()> local_d0;
  anon_class_16_1_6a50d06e local_b0;
  function<void_()> local_a0;
  undefined1 local_80 [48];
  undefined1 local_50 [8];
  shared_ptr<_5bfabb08_> runner;
  undefined1 local_30 [8];
  weak_ptr<_4fdb7c5e_> self;
  executor *executor_local;
  bool reset_local;
  task_impl_base<_1a67ba37_> *this_local;
  
  if (((this->schedule_mode_ & 1U) != 0) &&
     ((self.super___weak_ptr<_b961c150_>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)executor, reset ||
      (bVar2 = std::__basic_future<void>::valid(&(this->future_).super___basic_future<void>), !bVar2
      )))) {
    if (reset) {
      peVar3 = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->node_);
      node_manip::set_canceled(peVar3,false);
    }
    this_00 = &runner.super___shared_ptr<_9c7aa866_>._M_refcount;
    std::enable_shared_from_this<$4fdb7c5e$>::shared_from_this
              ((enable_shared_from_this<_4fdb7c5e_> *)this_00);
    std::
    weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>>
    ::
    weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,void>
              ((weak_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>>
                *)local_30,(shared_ptr<_4fdb7c5e_> *)this_00);
    std::shared_ptr<$4fdb7c5e$>::~shared_ptr((shared_ptr<_4fdb7c5e_> *)this_00);
    this_01 = (runner<_9c922731_> *)operator_new(0xb0);
    peVar3 = std::__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<transwarp::node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->node_);
    node_id = node::get_id(peVar3);
    runner<$9c922731$>::runner(this_01,node_id,(weak_ptr<_4fdb7c5e_> *)local_30,&this->parents_);
    std::
    shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<s...ptr<transwarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>>
    ::
    shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<s___ranswarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>,void>
              ((shared_ptr<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<s___ptr<transwarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>>
                *)local_50,this_01);
    raise_event(this,before_scheduled);
    std::__shared_ptr_access<$2198bb06$>::operator->((__shared_ptr_access<_2198bb06_> *)local_50);
    runner<$9c922731$>::get_future((runner<_9c922731_> *)local_80);
    std::shared_future<void>::shared_future
              ((shared_future<void> *)(local_80 + 0x10),(future<void> *)local_80);
    std::shared_future<void>::operator=(&this->future_,(shared_future<void> *)(local_80 + 0x10));
    std::shared_future<void>::~shared_future((shared_future<void> *)(local_80 + 0x10));
    std::future<void>::~future((future<void> *)local_80);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->executor_);
    _Var1 = self.super___weak_ptr<_b961c150_>._M_refcount;
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<transwarp::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<transwarp::executor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->executor_);
      std::shared_ptr<$5bfabb08$>::shared_ptr(&local_b0.runner,(shared_ptr<_5bfabb08_> *)local_50);
      std::function<void()>::
      function<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>::schedule_impl(bool,transwarp::executor*)::_lambda()_1_,void>
                ((function<void()> *)&local_a0,&local_b0);
      (*peVar4->_vptr_executor[3])(peVar4,&local_a0,&this->node_);
      std::function<void_()>::~function(&local_a0);
      task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
      ::schedule_impl(bool,transwarp::executor*)::{lambda()#1}::~executor((_lambda___1_ *)&local_b0)
      ;
    }
    else if (self.super___weak_ptr<_b961c150_>._M_refcount._M_pi ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_02 = std::__shared_ptr_access<$2198bb06$>::operator*
                          ((__shared_ptr_access<_2198bb06_> *)local_50);
      runner<$9c922731$>::operator()(this_02);
    }
    else {
      std::shared_ptr<$5bfabb08$>::shared_ptr(&local_e0.runner,(shared_ptr<_5bfabb08_> *)local_50);
      std::function<void()>::
      function<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>::schedule_impl(bool,transwarp::executor*)::_lambda()_2_,void>
                ((function<void()> *)&local_d0,&local_e0);
      (*(_Var1._M_pi)->_vptr__Sp_counted_base[3])(_Var1._M_pi,&local_d0,&this->node_);
      std::function<void_()>::~function(&local_d0);
      task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>
      ::schedule_impl(bool,transwarp::executor*)::{lambda()#2}::~executor((_lambda___2_ *)&local_e0)
      ;
    }
    std::shared_ptr<$5bfabb08$>::~shared_ptr((shared_ptr<_5bfabb08_> *)local_50);
    std::weak_ptr<$4fdb7c5e$>::~weak_ptr((weak_ptr<_4fdb7c5e_> *)local_30);
  }
  return;
}

Assistant:

void schedule_impl(bool reset, transwarp::executor* executor=nullptr) override {
        if (schedule_mode_ && (reset || !future_.valid())) {
            if (reset) {
                transwarp::detail::node_manip::set_canceled(*node_, false);
            }
            std::weak_ptr<task_impl_base> self = this->shared_from_this();
            using runner_t = transwarp::detail::runner<result_type, task_type, task_impl_base, decltype(parents_)>;
            std::shared_ptr<runner_t> runner = std::shared_ptr<runner_t>(new runner_t(node_->get_id(), self, parents_));
            raise_event(transwarp::event_type::before_scheduled);
            future_ = runner->get_future();
            if (executor_) {
                executor_->execute([runner]{ (*runner)(); }, node_);
            } else if (executor) {
                executor->execute([runner]{ (*runner)(); }, node_);
            } else {
                (*runner)();
            }
        }
    }